

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_compare.c
# Opt level: O2

void print_usage(char *progname)

{
  fprintf(_stderr,"Usage: %s [-pa] version1 [op] version2\n",progname);
  fputc(10,_stderr);
  fwrite(" op       - if specified (supports <, <=, =, >=, >, lt, le, eq, ge, gt),\n",0x49,1,_stderr
        );
  fwrite("            the utility would exit with zero (success) status code if the\n",0x4a,1,
         _stderr);
  fwrite("            given condition is satisfied.  Otherwise, the utility would\n",0x48,1,_stderr)
  ;
  fwrite("            print <, =, or > to indicate how specified versions compare.\n",0x49,1,_stderr
        );
  fputc(10,_stderr);
  fwrite(" -p       - \'p\' letter is treated as \'patch\' instead of \'pre\'\n",0x3e,1,_stderr);
  fwrite(" -a       - any alphabetic characters are treated as post-release\n",0x42,1,_stderr);
  fputc(10,_stderr);
  fwrite(" -h, -?   - print usage and exit\n",0x21,1,_stderr);
  fwrite(" -v       - print version and exit\n",0x23,1,_stderr);
  return;
}

Assistant:

static void print_usage(const char* progname) {
	fprintf(stderr, "Usage: %s [-pa] version1 [op] version2\n", progname);
	fprintf(stderr, "\n");
	fprintf(stderr, " op       - if specified (supports <, <=, =, >=, >, lt, le, eq, ge, gt),\n");
	fprintf(stderr, "            the utility would exit with zero (success) status code if the\n");
	fprintf(stderr, "            given condition is satisfied.  Otherwise, the utility would\n");
	fprintf(stderr, "            print <, =, or > to indicate how specified versions compare.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, " -p       - 'p' letter is treated as 'patch' instead of 'pre'\n");
	fprintf(stderr, " -a       - any alphabetic characters are treated as post-release\n");
	fprintf(stderr, "\n");
	fprintf(stderr, " -h, -?   - print usage and exit\n");
	fprintf(stderr, " -v       - print version and exit\n");
}